

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlXPathRegisterVariable(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlXPathObjectPtr local_68;
  PyObject *local_60;
  PyObject *pyobj_value;
  PyObject *pyobj_ctx;
  xmlXPathObjectPtr val;
  xmlXPathContextPtr ctx;
  xmlChar *ns_uri;
  xmlChar *name;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  name._4_4_ = 0;
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OszO:xpathRegisterVariable",&pyobj_value,&ns_uri,&ctx,&local_60);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (pyobj_value == (PyObject *)&_Py_NoneStruct) {
      local_68 = (xmlXPathObjectPtr)0x0;
    }
    else {
      local_68 = (xmlXPathObjectPtr)pyobj_value[1].ob_refcnt;
    }
    val = local_68;
    pyobj_ctx = (PyObject *)libxml_xmlXPathObjectPtrConvert(local_60);
    name._4_4_ = xmlXPathRegisterVariableNS(val,ns_uri,ctx,pyobj_ctx);
    self_local = libxml_intWrap(name._4_4_);
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlXPathRegisterVariable(ATTRIBUTE_UNUSED PyObject * self,
                                PyObject * args)
{
    PyObject *py_retval;
    int c_retval = 0;
    xmlChar *name;
    xmlChar *ns_uri;
    xmlXPathContextPtr ctx;
    xmlXPathObjectPtr val;
    PyObject *pyobj_ctx;
    PyObject *pyobj_value;

    if (!PyArg_ParseTuple
        (args, (char *) "OszO:xpathRegisterVariable", &pyobj_ctx, &name,
         &ns_uri, &pyobj_value))
        return (NULL);

    ctx = (xmlXPathContextPtr) PyxmlXPathContext_Get(pyobj_ctx);
    val = libxml_xmlXPathObjectPtrConvert(pyobj_value);

    c_retval = xmlXPathRegisterVariableNS(ctx, name, ns_uri, val);
    py_retval = libxml_intWrap(c_retval);
    return (py_retval);
}